

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O0

JsonMappingApi * __thiscall
cfd::js::api::json::JsonMappingApi::CreateExtPubkey(JsonMappingApi *this,string *request_message)

{
  function<cfd::js::api::CreateExtkeyResponseStruct_(const_cfd::js::api::CreateExtPubkeyRequestStruct_&)>
  local_38;
  string *local_18;
  string *request_message_local;
  
  local_18 = request_message;
  request_message_local = (string *)this;
  std::
  function<cfd::js::api::CreateExtkeyResponseStruct(cfd::js::api::CreateExtPubkeyRequestStruct_const&)>
  ::
  function<cfd::js::api::CreateExtkeyResponseStruct(&)(cfd::js::api::CreateExtPubkeyRequestStruct_const&),void>
            ((function<cfd::js::api::CreateExtkeyResponseStruct(cfd::js::api::CreateExtPubkeyRequestStruct_const&)>
              *)&local_38,HDWalletStructApi::CreateExtPubkey);
  ExecuteJsonApi<cfd::js::api::json::CreateExtPubkeyRequest,cfd::js::api::json::CreateExtkeyResponse,cfd::js::api::CreateExtPubkeyRequestStruct,cfd::js::api::CreateExtkeyResponseStruct>
            ((json *)this,request_message,&local_38);
  std::
  function<cfd::js::api::CreateExtkeyResponseStruct_(const_cfd::js::api::CreateExtPubkeyRequestStruct_&)>
  ::~function(&local_38);
  return this;
}

Assistant:

std::string JsonMappingApi::CreateExtPubkey(
    const std::string &request_message) {
  return ExecuteJsonApi<
      api::json::CreateExtPubkeyRequest, api::json::CreateExtkeyResponse,
      api::CreateExtPubkeyRequestStruct, api::CreateExtkeyResponseStruct>(
      request_message, HDWalletStructApi::CreateExtPubkey);
}